

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O2

void __thiscall
duckdb::BitpackingState<signed_char,_signed_char>::Reset
          (BitpackingState<signed_char,_signed_char> *this)

{
  this->minimum = '\x7f';
  this->maximum = -0x80;
  this->min_max_diff = '\0';
  this->minimum_delta = '\x7f';
  this->maximum_delta = -0x80;
  this->min_max_delta_diff = '\0';
  this->delta_offset = '\0';
  this->all_valid = true;
  this->all_invalid = true;
  this->can_do_delta = false;
  this->can_do_for = false;
  this->compression_buffer_idx = 0;
  return;
}

Assistant:

void Reset() {
		minimum = NumericLimits<T>::Maximum();
		minimum_delta = NumericLimits<T_S>::Maximum();
		maximum = NumericLimits<T>::Minimum();
		maximum_delta = NumericLimits<T_S>::Minimum();
		delta_offset = 0;
		all_valid = true;
		all_invalid = true;
		can_do_delta = false;
		can_do_for = false;
		compression_buffer_idx = 0;
		min_max_diff = 0;
		min_max_delta_diff = 0;
	}